

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O0

merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_merge_iterator<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::greater<void>>
          (merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this,undefined8 param_3,
          tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&>
          *param_4)

{
  vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_90;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  local_78;
  tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&> local_48
  ;
  detail local_30 [8];
  tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&>
  common_ranges;
  tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&>
  *ranges_local;
  
  local_48.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&>
  .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>_&>.
  super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl =
       *(_Head_base<1UL,_std::vector<int,_std::allocator<int>_>_&,_false> *)this;
  local_48.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl =
       *(vector<int,_std::allocator<int>_> **)(this + 8);
  common_ranges.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_&,_false>._M_head_impl =
       (vector<int,_std::allocator<int>_> *)this;
  detail::
  uniform_range_tuple_please<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            (local_30,&local_48);
  apply<burst::make_range_vector_t_const&,std::tuple<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&>&>
            (&local_90,(burst *)&make_range_vector,(make_range_vector_t *)local_30,param_4);
  own_as_range_t::operator()(&local_78,(own_as_range_t *)&own_as_range,&local_90);
  make_merge_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>>>>,std::greater<void>>
            (__return_storage_ptr__,(burst *)&local_78);
  boost::
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  ::~iterator_range(&local_78);
  std::
  vector<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&local_90);
  return __return_storage_ptr__;
}

Assistant:

auto make_merge_iterator (std::tuple<Ranges &...> ranges, Compare compare)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_merge_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges)),
                std::move(compare)
            );
    }